

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

void __thiscall
curlpp::FormParts::Content::Content(Content *this,char *name,char *content,char *contentType)

{
  allocator local_22;
  allocator local_21;
  
  FormPart::FormPart(&this->super_FormPart,name);
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__Content_00134be0;
  std::__cxx11::string::string((string *)&this->mContent,content,&local_21);
  std::__cxx11::string::string((string *)&this->mContentType,contentType,&local_22);
  return;
}

Assistant:

curlpp::FormParts::Content::Content(const char * name, 
				    const char * content, const char * contentType)
  : FormPart(name)
  , mContent(content)
  , mContentType(contentType)
{}